

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderQualifiers.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderFlatInterpolationTest::initProgram(GeometryShaderFlatInterpolationTest *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *vs_code_specialized_raw;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  string vs_code_specialized;
  string gs_code_specialized;
  string fs_code_specialized;
  long lVar5;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0x74);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0x79);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&initProgram::fs_code_raw);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_code_specialized,&this->super_TestCaseBase,1,&initProgram::gs_code_raw);
  gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&initProgram::vs_code_raw);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  (**(code **)(lVar5 + 0x14c8))(this->m_po_id,1,&initProgram::po_varying,0x8c8c);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
                  ,0xb3);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                     &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,this->m_fs_id
                     ,1,&fs_code_specialized_raw,(bool *)0x0);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
      operator_delete(vs_code_specialized._M_dataplus._M_p,
                      vs_code_specialized.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
      operator_delete(gs_code_specialized._M_dataplus._M_p,
                      gs_code_specialized.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
      operator_delete(fs_code_specialized._M_dataplus._M_p,
                      fs_code_specialized.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not build test program object",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderQualifiers.cpp"
             ,0xba);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderFlatInterpolationTest::initProgram()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Create the program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Set the test program object up */
	static const char* fs_code_raw = "${VERSION}\n"
									 "\n"
									 "precision highp float;\n"
									 "\n"
									 "out vec4 result;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    result = vec4(1.0);\n"
									 "}\n";

	static const char* gs_code_raw = "${VERSION}\n"
									 "${GEOMETRY_SHADER_REQUIRE}\n"
									 "\n"
									 "layout(triangles)                in;\n"
									 "layout(points, max_vertices = 1) out;\n"
									 "\n"
									 "flat in int out_vertex[];\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    if (out_vertex[0] != 0 || out_vertex[1] != 1 || out_vertex[2] != 2)\n"
									 "    {\n"
									 "        gl_Position = vec4(0.0);\n"
									 "    }\n"
									 "    else\n"
									 "    {\n"
									 "        gl_Position = vec4(1.0);\n"
									 "    }\n"
									 "    EmitVertex();\n"
									 "}\n";

	static const char* po_varying  = "gl_Position";
	static const char* vs_code_raw = "${VERSION}\n"
									 "\n"
									 "flat out int out_vertex;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    gl_Position = vec4(0.0);\n"
									 "    out_vertex  = gl_VertexID;\n"
									 "}\n";

	std::string fs_code_specialized = TestCaseBase::specializeShader(1, /* parts */
																	 &fs_code_raw);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();
	std::string gs_code_specialized		= TestCaseBase::specializeShader(1, /* parts */
																	 &gs_code_raw);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();
	std::string vs_code_specialized		= TestCaseBase::specializeShader(1, /* parts */
																	 &vs_code_raw);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	gl.transformFeedbackVaryings(m_po_id, 1, /* count */
								 &po_varying, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw))
	{
		TCU_FAIL("Could not build test program object");
	}
}